

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsInteractionTestUtil.cpp
# Opt level: O1

void deqp::gls::InteractionTestUtil::computeRandomQuad
               (Random *rnd,IntegerQuad *quad,int targetWidth,int targetHeight)

{
  undefined8 *puVar1;
  ulong uVar2;
  undefined4 uVar3;
  int iVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  deBool dVar8;
  deBool dVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  float __tmp;
  float fVar17;
  float val;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  
  fVar17 = ceilf((float)targetWidth * 0.5);
  iVar15 = (int)fVar17;
  fVar17 = ceilf((float)targetHeight * 0.5);
  iVar4 = (int)fVar17;
  dVar5 = deRandom_getUint32(&rnd->m_rnd);
  if (targetWidth != 0x7fffffff || iVar15 != -0x80000000) {
    dVar5 = dVar5 % ((targetWidth - iVar15) + 1U) + iVar15;
  }
  dVar6 = deRandom_getUint32(&rnd->m_rnd);
  if (targetHeight != 0x7fffffff || iVar4 != -0x80000000) {
    dVar6 = dVar6 % ((targetHeight - iVar4) + 1U) + iVar4;
  }
  dVar7 = deRandom_getUint32(&rnd->m_rnd);
  lVar16 = 0;
  uVar2 = (ulong)dVar7 % (ulong)((targetWidth - dVar5) + 1);
  dVar7 = deRandom_getUint32(&rnd->m_rnd);
  uVar14 = (ulong)dVar7 % (ulong)((targetHeight - dVar6) + 1);
  dVar8 = deRandom_getBool(&rnd->m_rnd);
  dVar9 = deRandom_getBool(&rnd->m_rnd);
  local_40 = 0;
  de::Random::choose<float_const*,float*>
            (rnd,computeRandomQuad::depthValues,getRandomColor::components,(float *)&local_40,1);
  uVar3 = local_40;
  uVar10 = (dVar6 - 1) + (int)uVar14;
  uVar12 = uVar14;
  if (dVar9 == 1) {
    uVar12 = (ulong)uVar10;
  }
  uVar11 = (ulong)uVar10;
  if (dVar9 == 1) {
    uVar11 = uVar14;
  }
  uVar10 = (dVar5 - 1) + (int)uVar2;
  uVar14 = uVar2;
  if (dVar8 == 1) {
    uVar14 = (ulong)uVar10;
  }
  uVar13 = (ulong)uVar10;
  if (dVar8 == 1) {
    uVar13 = uVar2;
  }
  *(ulong *)(quad->posA).m_data = uVar14 | uVar12 << 0x20;
  *(ulong *)(quad->posB).m_data = uVar13 | uVar11 << 0x20;
  do {
    getRandomColor((InteractionTestUtil *)&local_40,rnd);
    puVar1 = (undefined8 *)((long)quad->color[0].m_data + lVar16);
    *puVar1 = CONCAT44(uStack_3c,local_40);
    puVar1[1] = uStack_38;
    lVar16 = lVar16 + 0x10;
  } while (lVar16 != 0x40);
  lVar16 = 0;
  do {
    *(undefined4 *)((long)quad->depth + lVar16) = uVar3;
    lVar16 = lVar16 + 4;
  } while (lVar16 != 0x10);
  return;
}

Assistant:

void computeRandomQuad (de::Random& rnd, gls::FragmentOpUtil::IntegerQuad& quad, int targetWidth, int targetHeight)
{
	// \note In viewport coordinates.
	// \todo [2012-12-18 pyry] Out-of-bounds values.
	// \note Not using depth 1.0 since clearing with 1.0 and rendering with 1.0 may not be same value.
	static const float depthValues[] = { 0.0f, 0.2f, 0.4f, 0.5f, 0.51f, 0.6f, 0.8f, 0.95f };

	const int		maxOutOfBounds		= 0;
	const float		minSize				= 0.5f;

	int minW		= deCeilFloatToInt32(minSize * (float)targetWidth);
	int minH		= deCeilFloatToInt32(minSize * (float)targetHeight);
	int maxW		= targetWidth + 2*maxOutOfBounds;
	int maxH		= targetHeight + 2*maxOutOfBounds;

	int width		= rnd.getInt(minW, maxW);
	int	height		= rnd.getInt(minH, maxH);
	int x			= rnd.getInt(-maxOutOfBounds, targetWidth+maxOutOfBounds-width);
	int y			= rnd.getInt(-maxOutOfBounds, targetHeight+maxOutOfBounds-height);

	bool flipX		= rnd.getBool();
	bool flipY		= rnd.getBool();

	float depth		= rnd.choose<float>(DE_ARRAY_BEGIN(depthValues), DE_ARRAY_END(depthValues));

	quad.posA	= IVec2(flipX ? (x+width-1) : x, flipY ? (y+height-1) : y);
	quad.posB	= IVec2(flipX ? x : (x+width-1), flipY ? y : (y+height-1));

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(quad.color); ndx++)
		quad.color[ndx] = getRandomColor(rnd);

	std::fill(DE_ARRAY_BEGIN(quad.depth), DE_ARRAY_END(quad.depth), depth);
}